

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.h
# Opt level: O2

bool dgrminer::operator<(anomaly_pattern_with_occurrences *lhs,anomaly_pattern_with_occurrences *rhs
                        )

{
  pointer paVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = 0xffffffffffffffff;
  lVar5 = 0;
  do {
    paVar1 = (lhs->minimum_code).
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar4 = 0x28;
    uVar3 = ((long)(lhs->minimum_code).
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0x28;
    uVar6 = uVar6 + 1;
    if (uVar3 <= uVar6) goto LAB_00114693;
    bVar2 = is_pattern_edge_smaller_than
                      ((array<int,_10UL> *)((long)paVar1->_M_elems + lVar5),
                       (array<int,_10UL> *)
                       ((long)((rhs->minimum_code).
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5),true);
    if (bVar2) {
      bVar4 = 1;
      goto LAB_00114693;
    }
    bVar2 = is_pattern_edge_equal_to
                      ((array<int,_10UL> *)
                       ((long)((lhs->minimum_code).
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5),
                       (array<int,_10UL> *)
                       ((long)((rhs->minimum_code).
                               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar5),true);
    lVar5 = lVar5 + 0x28;
  } while (bVar2);
  bVar4 = 0;
LAB_00114693:
  return (bool)(uVar6 < uVar3 & bVar4);
}

Assistant:

inline bool operator<(const anomaly_pattern_with_occurrences& lhs, const anomaly_pattern_with_occurrences& rhs)
    {
        // (ignoring edge id)
        //return is_pattern_edge_smaller_than(lhs.elements, rhs.elements, true);
        for (size_t i = 0; i < lhs.minimum_code.size(); i++)
        {
            bool intermediate_res = is_pattern_edge_smaller_than(lhs.minimum_code[i], rhs.minimum_code[i], true);
            if (intermediate_res)
            {
                return true;
            }
            else
            {
                intermediate_res = is_pattern_edge_equal_to(lhs.minimum_code[i], rhs.minimum_code[i], true);
                if (!intermediate_res)
                {
                    return false;
                }
            }
        }
        return false;
    }